

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasWeightOfType(Model *model,WeightParamType *wt)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  NeuralNetworkLayer *layer_00;
  NeuralNetworkLayer *layer;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  WeightParamType *wt_local;
  Model *model_local;
  
  this = getNNSpec(model);
  if (this != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
    for (layer._4_4_ = 0;
        iVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                          (this), layer._4_4_ < iVar2; layer._4_4_ = layer._4_4_ + 1) {
      layer_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                 operator[](this,layer._4_4_);
      bVar1 = hasWeightOfType(layer_00,wt);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CoreML::hasWeightOfType(const Specification::Model& model, const WeightParamType& wt) {
    auto layers = getNNSpec(model);
    if(layers) {
        for(int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if(hasWeightOfType(layer,wt)) {
                return true;
            }
        }
    }
    return false;
}